

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<std::array<float,4ul>>
          (Attribute *this,double t,array<float,_4UL> *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::array<float,_4UL>_> local_60;
  undefined1 local_4c [8];
  optional<std::array<float,_4UL>_> v;
  TimeSampleInterpolationType tinterp_local;
  array<float,_4UL> *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (array<float,_4UL> *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&v.contained + 8),t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&v.contained + 8));
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<std::array<float,4ul>>(&local_60,&this->_var);
      nonstd::optional_lite::optional<std::array<float,_4UL>_>::optional<std::array<float,_4UL>,_0>
                ((optional<std::array<float,_4UL>_> *)local_4c,&local_60);
      nonstd::optional_lite::optional<std::array<float,_4UL>_>::~optional(&local_60);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_4c);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value
                           ((optional<std::array<float,_4UL>_> *)local_4c);
        *(undefined8 *)dst->_M_elems = *(undefined8 *)pvVar2->_M_elems;
        *(undefined8 *)(dst->_M_elems + 2) = *(undefined8 *)(pvVar2->_M_elems + 2);
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<std::array<float,_4UL>_>::~optional
                ((optional<std::array<float,_4UL>_> *)local_4c);
      if (bVar1) goto LAB_007b5520;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<std::array<float,4ul>>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<std::array<float,4ul>>(this,dst);
    }
  }
LAB_007b5520:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }